

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O2

aiMesh * Assimp::MakeSubmesh(aiMesh *pMesh,
                            vector<unsigned_int,_std::allocator<unsigned_int>_> *subMeshFaces,
                            uint subFlags)

{
  aiColor4D *paVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  pointer puVar6;
  pointer puVar7;
  aiVector3D *paVar8;
  aiBone *paVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  bool bVar25;
  uint uVar26;
  size_t b;
  aiMesh *this;
  aiVector3D *paVar27;
  aiColor4D *paVar28;
  ulong *puVar29;
  aiFace *paVar30;
  uint *puVar31;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar32;
  aiBone **__s;
  aiBone *this_00;
  aiVertexWeight *paVar33;
  uint a_2;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  aiFace *paVar37;
  ulong uVar38;
  size_t a;
  long lVar39;
  allocator_type local_99;
  ulong local_98;
  ulong local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  uint local_80;
  value_type_conflict1 local_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subBones;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vMap;
  
  local_80 = subFlags;
  this = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this);
  subBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&vMap,(ulong)pMesh->mNumVertices,(value_type_conflict1 *)&subBones,
             (allocator_type *)&local_7c);
  puVar6 = (subMeshFaces->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (subMeshFaces->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar34 = (long)puVar7 - (long)puVar6;
  local_98 = lVar34 >> 2;
  uVar38 = 0;
  for (uVar26 = 0; uVar26 < local_98; uVar26 = uVar26 + 1) {
    uVar3 = (subMeshFaces->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar26];
    paVar30 = pMesh->mFaces;
    for (uVar36 = 0; uVar36 < paVar30[uVar3].mNumIndices; uVar36 = uVar36 + 1) {
      uVar4 = paVar30[uVar3].mIndices[uVar36];
      if (vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] == 0xffffffff) {
        vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] = (uint)uVar38;
        uVar38 = uVar38 + 1;
      }
    }
  }
  if (this != pMesh) {
    uVar26 = (pMesh->mName).length;
    (this->mName).length = uVar26;
    memcpy((this->mName).data,(pMesh->mName).data,(ulong)uVar26);
    (this->mName).data[uVar26] = '\0';
  }
  this->mMaterialIndex = pMesh->mMaterialIndex;
  this->mPrimitiveTypes = pMesh->mPrimitiveTypes;
  this->mNumFaces =
       (uint)((ulong)((long)(subMeshFaces->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(subMeshFaces->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start) >> 2);
  this->mNumVertices = (uint)uVar38;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar38;
  uVar36 = SUB168(auVar10 * ZEXT816(0xc),0);
  local_90 = 0xffffffffffffffff;
  if (SUB168(auVar10 * ZEXT816(0xc),8) == 0) {
    local_90 = uVar36;
  }
  local_88 = subMeshFaces;
  paVar27 = (aiVector3D *)operator_new__(local_90);
  if (uVar38 != 0) {
    memset(paVar27,0,((uVar36 - 0xc) - (uVar36 - 0xc) % 0xc) + 0xc);
  }
  this->mVertices = paVar27;
  if ((pMesh->mNormals != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
    paVar27 = (aiVector3D *)operator_new__(local_90);
    if (uVar38 != 0) {
      memset(paVar27,0,((uVar36 - 0xc) - (uVar36 - 0xc) % 0xc) + 0xc);
    }
    this->mNormals = paVar27;
  }
  bVar25 = aiMesh::HasTangentsAndBitangents(pMesh);
  if (bVar25) {
    paVar27 = (aiVector3D *)operator_new__(local_90);
    if (uVar38 != 0) {
      memset(paVar27,0,((uVar36 - 0xc) - (uVar36 - 0xc) % 0xc) + 0xc);
    }
    this->mTangents = paVar27;
    paVar27 = (aiVector3D *)operator_new__(local_90);
    if (uVar38 != 0) {
      memset(paVar27,0,((uVar36 - 0xc) - (uVar36 - 0xc) % 0xc) + 0xc);
    }
    this->mBitangents = paVar27;
  }
  lVar39 = 0;
  while (((lVar39 != 8 && (pMesh->mTextureCoords[(uint)lVar39 & 7] != (aiVector3D *)0x0)) &&
         (pMesh->mNumVertices != 0))) {
    paVar27 = (aiVector3D *)operator_new__(local_90);
    if (uVar38 != 0) {
      memset(paVar27,0,((uVar36 - 0xc) - (uVar36 - 0xc) % 0xc) + 0xc);
    }
    this->mTextureCoords[lVar39] = paVar27;
    this->mNumUVComponents[lVar39] = pMesh->mNumUVComponents[lVar39];
    lVar39 = lVar39 + 1;
  }
  lVar39 = 0;
  while (((lVar39 != 8 && (pMesh->mColors[(uint)lVar39 & 7] != (aiColor4D *)0x0)) &&
         (pMesh->mNumVertices != 0))) {
    paVar28 = (aiColor4D *)operator_new__(-(ulong)(uVar38 >> 0x3c != 0) | uVar38 << 4);
    if (uVar38 != 0) {
      memset(paVar28,0,uVar38 << 4);
    }
    this->mColors[lVar39] = paVar28;
    lVar39 = lVar39 + 1;
  }
  puVar29 = (ulong *)operator_new__(lVar34 * 4 + 8);
  *puVar29 = local_98;
  paVar30 = (aiFace *)(puVar29 + 1);
  if (puVar7 != puVar6) {
    paVar37 = paVar30;
    do {
      paVar37->mNumIndices = 0;
      paVar37->mIndices = (uint *)0x0;
      paVar37 = paVar37 + 1;
    } while (paVar37 != paVar30 + local_98);
  }
  this->mFaces = paVar30;
  uVar26 = 0;
  while( true ) {
    uVar38 = (ulong)uVar26;
    if (local_98 <= uVar38) break;
    paVar30 = pMesh->mFaces;
    uVar3 = (local_88->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar38];
    paVar37 = this->mFaces;
    uVar4 = paVar30[uVar3].mNumIndices;
    paVar37[uVar38].mNumIndices = uVar4;
    puVar31 = (uint *)operator_new__((ulong)uVar4 << 2);
    paVar37 = paVar37 + uVar38;
    paVar37->mIndices = puVar31;
    for (uVar38 = 0; uVar38 < paVar37->mNumIndices; uVar38 = uVar38 + 1) {
      paVar37->mIndices[uVar38] =
           vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[paVar30[uVar3].mIndices[uVar38]];
    }
    uVar26 = uVar26 + 1;
  }
  for (uVar38 = 0; uVar38 < pMesh->mNumVertices; uVar38 = uVar38 + 1) {
    uVar36 = (ulong)vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar38];
    if (uVar36 != 0xffffffff) {
      paVar27 = pMesh->mVertices;
      paVar8 = this->mVertices;
      paVar8[uVar36].z = paVar27[uVar38].z;
      paVar27 = paVar27 + uVar38;
      fVar5 = paVar27->y;
      paVar8 = paVar8 + uVar36;
      paVar8->x = paVar27->x;
      paVar8->y = fVar5;
      paVar27 = pMesh->mNormals;
      if ((paVar27 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
        paVar8 = this->mNormals;
        paVar8[uVar36].z = paVar27[uVar38].z;
        fVar5 = paVar27[uVar38].y;
        paVar8 = paVar8 + uVar36;
        paVar8->x = paVar27[uVar38].x;
        paVar8->y = fVar5;
      }
      bVar25 = aiMesh::HasTangentsAndBitangents(pMesh);
      if (bVar25) {
        paVar27 = pMesh->mTangents;
        paVar8 = this->mTangents;
        paVar8[uVar36].z = paVar27[uVar38].z;
        paVar27 = paVar27 + uVar38;
        fVar5 = paVar27->y;
        paVar8 = paVar8 + uVar36;
        paVar8->x = paVar27->x;
        paVar8->y = fVar5;
        paVar27 = pMesh->mBitangents;
        paVar8 = this->mBitangents;
        paVar8[uVar36].z = paVar27[uVar38].z;
        paVar27 = paVar27 + uVar38;
        fVar5 = paVar27->y;
        paVar8 = paVar8 + uVar36;
        paVar8->x = paVar27->x;
        paVar8->y = fVar5;
      }
      uVar26 = aiMesh::GetNumUVChannels(pMesh);
      for (uVar35 = 0; uVar26 != uVar35; uVar35 = uVar35 + 1) {
        paVar27 = pMesh->mTextureCoords[uVar35];
        paVar8 = this->mTextureCoords[uVar35];
        paVar8[uVar36].z = paVar27[uVar38].z;
        paVar27 = paVar27 + uVar38;
        fVar5 = paVar27->y;
        paVar8 = paVar8 + uVar36;
        paVar8->x = paVar27->x;
        paVar8->y = fVar5;
      }
      uVar26 = aiMesh::GetNumColorChannels(pMesh);
      for (uVar35 = 0; uVar26 != uVar35; uVar35 = uVar35 + 1) {
        paVar28 = pMesh->mColors[uVar35] + uVar38;
        fVar5 = paVar28->g;
        fVar11 = paVar28->b;
        fVar12 = paVar28->a;
        paVar1 = this->mColors[uVar35] + uVar36;
        paVar1->r = paVar28->r;
        paVar1->g = fVar5;
        paVar1->b = fVar11;
        paVar1->a = fVar12;
      }
    }
  }
  if ((local_80 & 1) == 0) {
    local_7c = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&subBones,(ulong)pMesh->mNumBones,&local_7c,&local_99);
    for (uVar38 = 0; uVar36 = (ulong)pMesh->mNumBones, uVar38 < uVar36; uVar38 = uVar38 + 1) {
      paVar9 = pMesh->mBones[uVar38];
      for (uVar36 = 0; uVar36 < paVar9->mNumWeights; uVar36 = uVar36 + 1) {
        if (vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[paVar9->mWeights[uVar36].mVertexId] != 0xffffffff) {
          piVar2 = (int *)(CONCAT44(subBones.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    subBones.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar38 * 4);
          *piVar2 = *piVar2 + 1;
        }
      }
    }
    for (uVar38 = 0; uVar36 != uVar38; uVar38 = uVar38 + 1) {
      if (*(int *)(CONCAT44(subBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            subBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar38 * 4) != 0) {
        this->mNumBones = this->mNumBones + 1;
      }
    }
    pvVar32 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)this->mNumBones;
    if (pvVar32 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      local_88 = pvVar32;
      __s = (aiBone **)operator_new__((long)pvVar32 * 8);
      memset(__s,0,(long)pvVar32 * 8);
      this->mBones = __s;
      this->mNumBones = 0;
      for (uVar38 = 0; uVar38 < uVar36; uVar38 = uVar38 + 1) {
        if (*(int *)(CONCAT44(subBones.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              subBones.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar38 * 4) != 0) {
          this_00 = (aiBone *)operator_new(0x450);
          aiBone::aiBone(this_00);
          uVar26 = this->mNumBones;
          this->mNumBones = uVar26 + 1;
          this->mBones[uVar26] = this_00;
          paVar9 = pMesh->mBones[uVar38];
          if (this_00 != paVar9) {
            uVar26 = (paVar9->mName).length;
            (this_00->mName).length = uVar26;
            memcpy((this_00->mName).data,(paVar9->mName).data,(ulong)uVar26);
            (this_00->mName).data[uVar26] = '\0';
          }
          fVar21 = (paVar9->mOffsetMatrix).a1;
          fVar22 = (paVar9->mOffsetMatrix).a2;
          fVar23 = (paVar9->mOffsetMatrix).a3;
          fVar24 = (paVar9->mOffsetMatrix).a4;
          fVar17 = (paVar9->mOffsetMatrix).b1;
          fVar18 = (paVar9->mOffsetMatrix).b2;
          fVar19 = (paVar9->mOffsetMatrix).b3;
          fVar20 = (paVar9->mOffsetMatrix).b4;
          fVar13 = (paVar9->mOffsetMatrix).c1;
          fVar14 = (paVar9->mOffsetMatrix).c2;
          fVar15 = (paVar9->mOffsetMatrix).c3;
          fVar16 = (paVar9->mOffsetMatrix).c4;
          fVar5 = (paVar9->mOffsetMatrix).d2;
          fVar11 = (paVar9->mOffsetMatrix).d3;
          fVar12 = (paVar9->mOffsetMatrix).d4;
          (this_00->mOffsetMatrix).d1 = (paVar9->mOffsetMatrix).d1;
          (this_00->mOffsetMatrix).d2 = fVar5;
          (this_00->mOffsetMatrix).d3 = fVar11;
          (this_00->mOffsetMatrix).d4 = fVar12;
          (this_00->mOffsetMatrix).c1 = fVar13;
          (this_00->mOffsetMatrix).c2 = fVar14;
          (this_00->mOffsetMatrix).c3 = fVar15;
          (this_00->mOffsetMatrix).c4 = fVar16;
          (this_00->mOffsetMatrix).b1 = fVar17;
          (this_00->mOffsetMatrix).b2 = fVar18;
          (this_00->mOffsetMatrix).b3 = fVar19;
          (this_00->mOffsetMatrix).b4 = fVar20;
          (this_00->mOffsetMatrix).a1 = fVar21;
          (this_00->mOffsetMatrix).a2 = fVar22;
          (this_00->mOffsetMatrix).a3 = fVar23;
          (this_00->mOffsetMatrix).a4 = fVar24;
          uVar26 = *(uint *)(CONCAT44(subBones.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      subBones.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar38 * 4)
          ;
          uVar36 = (ulong)uVar26 * 8;
          local_98 = uVar38;
          paVar33 = (aiVertexWeight *)operator_new__(uVar36);
          if (uVar26 != 0) {
            memset(paVar33,0,uVar36);
          }
          this_00->mWeights = paVar33;
          for (uVar38 = 0; uVar38 < paVar9->mNumWeights; uVar38 = uVar38 + 1) {
            uVar26 = vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[paVar9->mWeights[uVar38].mVertexId];
            if (uVar26 != 0xffffffff) {
              fVar5 = paVar9->mWeights[uVar38].mWeight;
              paVar33 = this_00->mWeights;
              uVar3 = this_00->mNumWeights;
              this_00->mNumWeights = uVar3 + 1;
              paVar33[uVar3].mVertexId = uVar26;
              paVar33[uVar3].mWeight = fVar5;
            }
          }
          uVar36 = (ulong)pMesh->mNumBones;
          uVar38 = local_98;
        }
      }
      if ((uint)local_88 != this->mNumBones) {
        __assert_fail("nbParanoia==oMesh->mNumBones",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ProcessHelper.cpp"
                      ,0x1b3,
                      "aiMesh *Assimp::MakeSubmesh(const aiMesh *, const std::vector<unsigned int> &, unsigned int)"
                     );
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&subBones.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vMap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return this;
}

Assistant:

aiMesh* MakeSubmesh(const aiMesh *pMesh, const std::vector<unsigned int> &subMeshFaces, unsigned int subFlags)
{
    aiMesh *oMesh = new aiMesh();
    std::vector<unsigned int> vMap(pMesh->mNumVertices,UINT_MAX);

    size_t numSubVerts = 0;
    size_t numSubFaces = subMeshFaces.size();

    for(unsigned int i=0;i<numSubFaces;i++) {
        const aiFace &f = pMesh->mFaces[subMeshFaces[i]];

        for(unsigned int j=0;j<f.mNumIndices;j++)   {
            if(vMap[f.mIndices[j]]==UINT_MAX)   {
                vMap[f.mIndices[j]] = static_cast<unsigned int>(numSubVerts++);
            }
        }
    }

    oMesh->mName = pMesh->mName;

    oMesh->mMaterialIndex = pMesh->mMaterialIndex;
    oMesh->mPrimitiveTypes = pMesh->mPrimitiveTypes;

    // create all the arrays for this mesh if the old mesh contained them

    oMesh->mNumFaces = static_cast<unsigned int>(subMeshFaces.size());
    oMesh->mNumVertices = static_cast<unsigned int>(numSubVerts);
    oMesh->mVertices = new aiVector3D[numSubVerts];
    if( pMesh->HasNormals() ) {
        oMesh->mNormals = new aiVector3D[numSubVerts];
    }

    if( pMesh->HasTangentsAndBitangents() ) {
        oMesh->mTangents = new aiVector3D[numSubVerts];
        oMesh->mBitangents = new aiVector3D[numSubVerts];
    }

    for( size_t a = 0;  pMesh->HasTextureCoords(static_cast<unsigned int>(a)) ; ++a ) {
        oMesh->mTextureCoords[a] = new aiVector3D[numSubVerts];
        oMesh->mNumUVComponents[a] = pMesh->mNumUVComponents[a];
    }

    for( size_t a = 0; pMesh->HasVertexColors( static_cast<unsigned int>(a)); ++a )    {
        oMesh->mColors[a] = new aiColor4D[numSubVerts];
    }

    // and copy over the data, generating faces with linear indices along the way
    oMesh->mFaces = new aiFace[numSubFaces];

    for(unsigned int a = 0; a < numSubFaces; ++a )  {

        const aiFace& srcFace = pMesh->mFaces[subMeshFaces[a]];
        aiFace& dstFace = oMesh->mFaces[a];
        dstFace.mNumIndices = srcFace.mNumIndices;
        dstFace.mIndices = new unsigned int[dstFace.mNumIndices];

        // accumulate linearly all the vertices of the source face
        for( size_t b = 0; b < dstFace.mNumIndices; ++b )   {
            dstFace.mIndices[b] = vMap[srcFace.mIndices[b]];
        }
    }

    for(unsigned int srcIndex = 0; srcIndex < pMesh->mNumVertices; ++srcIndex ) {
        unsigned int nvi = vMap[srcIndex];
        if(nvi==UINT_MAX) {
            continue;
        }

        oMesh->mVertices[nvi] = pMesh->mVertices[srcIndex];
        if( pMesh->HasNormals() ) {
            oMesh->mNormals[nvi] = pMesh->mNormals[srcIndex];
        }

        if( pMesh->HasTangentsAndBitangents() ) {
            oMesh->mTangents[nvi] = pMesh->mTangents[srcIndex];
            oMesh->mBitangents[nvi] = pMesh->mBitangents[srcIndex];
        }
        for( size_t c = 0, cc = pMesh->GetNumUVChannels(); c < cc; ++c )    {
                oMesh->mTextureCoords[c][nvi] = pMesh->mTextureCoords[c][srcIndex];
        }
        for( size_t c = 0, cc = pMesh->GetNumColorChannels(); c < cc; ++c ) {
            oMesh->mColors[c][nvi] = pMesh->mColors[c][srcIndex];
        }
    }

    if(~subFlags&AI_SUBMESH_FLAGS_SANS_BONES)   {
        std::vector<unsigned int> subBones(pMesh->mNumBones,0);

        for(unsigned int a=0;a<pMesh->mNumBones;++a)    {
            const aiBone* bone = pMesh->mBones[a];

            for(unsigned int b=0;b<bone->mNumWeights;b++)   {
                unsigned int v = vMap[bone->mWeights[b].mVertexId];

                if(v!=UINT_MAX) {
                    subBones[a]++;
                }
            }
        }

        for(unsigned int a=0;a<pMesh->mNumBones;++a)    {
            if(subBones[a]>0) {
                oMesh->mNumBones++;
            }
        }

        if(oMesh->mNumBones) {
            oMesh->mBones = new aiBone*[oMesh->mNumBones]();
            unsigned int nbParanoia = oMesh->mNumBones;

            oMesh->mNumBones = 0; //rewind

            for(unsigned int a=0;a<pMesh->mNumBones;++a)    {
                if(subBones[a]==0) {
                    continue;
                }
                aiBone *newBone = new aiBone;
                oMesh->mBones[oMesh->mNumBones++] = newBone;

                const aiBone* bone = pMesh->mBones[a];

                newBone->mName = bone->mName;
                newBone->mOffsetMatrix = bone->mOffsetMatrix;
                newBone->mWeights = new aiVertexWeight[subBones[a]];

                for(unsigned int b=0;b<bone->mNumWeights;b++)   {
                    const unsigned int v = vMap[bone->mWeights[b].mVertexId];

                    if(v!=UINT_MAX) {
                        aiVertexWeight w(v,bone->mWeights[b].mWeight);
                        newBone->mWeights[newBone->mNumWeights++] = w;
                    }
                }
            }

            ai_assert(nbParanoia==oMesh->mNumBones);
            (void)nbParanoia; // remove compiler warning on release build
        }
    }

    return oMesh;
}